

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O0

MessageModule * __thiscall
ki::protocol::dml::MessageManager::load_module(MessageManager *this,string *filepath)

{
  byte bVar1;
  bool bVar2;
  uchar service_id;
  ostream *poVar3;
  value_error *pvVar4;
  char *text;
  MessageModule *pMVar5;
  xml_node<char> *pxVar6;
  Record *this_00;
  char *pcVar7;
  Field<unsigned_char> *pFVar8;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pFVar9;
  MessageTemplate *pMVar10;
  size_type sVar11;
  size_type sVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>,_bool>
  pVar15;
  undefined1 auStack_10d28 [72];
  _Base_ptr p_Stack_10ce0;
  undefined1 uStack_10cd8;
  uint8_t uStack_10cc9;
  pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*> pStack_10cc8;
  undefined1 uStack_10cb1;
  string asStack_10cb0 [32];
  undefined1 auStack_10c90 [40];
  ostringstream oss_4;
  undefined1 auStack_10af8 [80];
  ostringstream oss_3;
  uint8_t auStack_10932 [2];
  string asStack_10930 [32];
  ostringstream aoStack_10910 [8];
  ostringstream oss_2;
  string asStack_10798 [32];
  MessageTemplate *pMStack_10778;
  MessageTemplate *message_template;
  undefined1 auStack_10768 [7];
  bool auto_sort;
  undefined1 auStack_10748 [40];
  string asStack_10720 [32];
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pFStack_10700;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description_field;
  string asStack_106f0 [32];
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pFStack_106d0;
  Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *type_field;
  string asStack_106c0 [32];
  Field<unsigned_char> *pFStack_106a0;
  Field<unsigned_char> *service_id_field;
  string asStack_10690 [8];
  string message_name;
  Record *record;
  xml_node<char> *record_node;
  xml_node<char> *node;
  xml_node<char> *root;
  string asStack_10648 [32];
  MessageModule *pMStack_10628;
  MessageModule *message_module;
  ostringstream oss_1;
  parse_error *e;
  xml_document<char> doc;
  char *data;
  undefined8 local_3e0;
  long local_3d8;
  size_t size;
  string local_3c8 [32];
  ostringstream local_3a8 [8];
  ostringstream oss;
  char local_220 [8];
  ifstream ifs;
  string *filepath_local;
  MessageManager *this_local;
  
  std::ifstream::ifstream(local_220,(string *)filepath,_S_ate);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_3a8);
    poVar3 = std::operator<<((ostream *)local_3a8,"Could not open file: ");
    std::operator<<(poVar3,(string *)filepath);
    size._7_1_ = 1;
    pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(pvVar4,local_3c8,MISSING_FILE);
    size._7_1_ = 0;
    __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
  }
  auVar14 = std::istream::tellg();
  local_3e0 = auVar14._8_8_;
  data = auVar14._0_8_;
  local_3d8 = std::fpos::operator_cast_to_long((fpos *)&data);
  std::istream::seekg((long)local_220,_S_beg);
  uVar13 = -(ulong)(local_3d8 + 1U == 0) | local_3d8 + 1U;
  text = (char *)operator_new__(uVar13);
  *text = '\0';
  memset(text + 1,0,uVar13 - 1);
  std::istream::read(local_220,(long)text);
  rapidxml::xml_document<char>::xml_document((xml_document<char> *)&e);
  rapidxml::xml_document<char>::parse<0>((xml_document<char> *)&e,text);
  pMVar5 = (MessageModule *)operator_new(200);
  root._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_10648,"",(allocator *)((long)&root + 7));
  MessageModule::MessageModule(pMVar5,'\0',(string *)asStack_10648);
  root._6_1_ = 0;
  std::__cxx11::string::~string(asStack_10648);
  std::allocator<char>::~allocator((allocator<char> *)((long)&root + 7));
  pMStack_10628 = pMVar5;
  pxVar6 = rapidxml::xml_node<char>::first_node((xml_node<char> *)&e,(char *)0x0,0,true);
  for (record_node = rapidxml::xml_node<char>::first_node(pxVar6,(char *)0x0,0,true);
      record_node != (xml_node<char> *)0x0;
      record_node = rapidxml::xml_node<char>::next_sibling(record_node,(char *)0x0,0,true)) {
    pxVar6 = rapidxml::xml_node<char>::first_node(record_node,(char *)0x0,0,true);
    if (pxVar6 != (xml_node<char> *)0x0) {
      this_00 = (Record *)operator_new(0x50);
      ki::dml::Record::Record(this_00);
      ki::dml::Record::from_xml(this_00,pxVar6);
      pcVar7 = rapidxml::xml_base<char>::name(&record_node->super_xml_base<char>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_10690,pcVar7,(allocator *)((long)&service_id_field + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&service_id_field + 7));
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              asStack_10690,"_ProtocolInfo");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(asStack_106c0,"ServiceID",(allocator *)((long)&type_field + 7))
        ;
        pFVar8 = ki::dml::Record::get_field<unsigned_char>(this_00,(string *)asStack_106c0);
        std::__cxx11::string::~string(asStack_106c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&type_field + 7));
        pFStack_106a0 = pFVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (asStack_106f0,"ProtocolType",(allocator *)((long)&description_field + 7));
        pFVar9 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,(string *)asStack_106f0);
        std::__cxx11::string::~string(asStack_106f0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&description_field + 7));
        pFStack_106d0 = pFVar9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (asStack_10720,"ProtocolDescription",(allocator *)(auStack_10748 + 0x27));
        pFVar9 = ki::dml::Record::get_field<std::__cxx11::string>(this_00,(string *)asStack_10720);
        std::__cxx11::string::~string(asStack_10720);
        std::allocator<char>::~allocator((allocator<char> *)(auStack_10748 + 0x27));
        pMVar5 = pMStack_10628;
        pFStack_10700 = pFVar9;
        if (pFStack_106a0 != (Field<unsigned_char> *)0x0) {
          service_id = ki::dml::Field<unsigned_char>::get_value(pFStack_106a0);
          MessageModule::set_service_id(pMVar5,service_id);
        }
        pMVar5 = pMStack_10628;
        if (pFStack_106d0 !=
            (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          ki::dml::
          Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          get_value((Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)auStack_10748);
          MessageModule::set_protocol_type(pMVar5,(string *)auStack_10748);
          std::__cxx11::string::~string((string *)auStack_10748);
        }
        pMVar5 = pMStack_10628;
        if (pFStack_10700 !=
            (Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x0) {
          ki::dml::
          Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          get_value((Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)auStack_10768);
          MessageModule::set_protocol_description(pMVar5,(string *)auStack_10768);
          std::__cxx11::string::~string((string *)auStack_10768);
        }
      }
      else {
        pxVar6 = rapidxml::xml_node<char>::next_sibling(record_node,(char *)0x0,0,true);
        pMVar5 = pMStack_10628;
        message_template._7_1_ = pxVar6 == (xml_node<char> *)0x0;
        std::__cxx11::string::string(asStack_10798,asStack_10690);
        pMVar10 = MessageModule::add_message_template
                            (pMVar5,(string *)asStack_10798,this_00,
                             (bool)(message_template._7_1_ & 1));
        std::__cxx11::string::~string(asStack_10798);
        pMStack_10778 = pMVar10;
        if (pMVar10 == (MessageTemplate *)0x0) {
          if (text != (char *)0x0) {
            operator_delete__(text);
          }
          pMVar5 = pMStack_10628;
          if (pMStack_10628 != (MessageModule *)0x0) {
            MessageModule::~MessageModule(pMStack_10628);
            operator_delete(pMVar5);
          }
          if (this_00 != (Record *)0x0) {
            ki::dml::Record::~Record(this_00);
            operator_delete(this_00);
          }
          std::__cxx11::ostringstream::ostringstream(aoStack_10910);
          std::operator<<((ostream *)aoStack_10910,"Failed to create message template for ");
          std::operator<<((ostream *)aoStack_10910,asStack_10690);
          auStack_10932[1] = 1;
          pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
          std::__cxx11::ostringstream::str();
          value_error::value_error(pvVar4,asStack_10930,NONE);
          auStack_10932[1] = 0;
          __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
        }
      }
      std::__cxx11::string::~string(asStack_10690);
    }
  }
  auStack_10932[0] = MessageModule::get_service_id(pMStack_10628);
  sVar11 = std::
           map<unsigned_char,_ki::protocol::dml::MessageModule_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
           ::count(&this->m_service_id_map,auStack_10932);
  if (sVar11 != 1) {
    MessageModule::get_protocol_type_abi_cxx11_((MessageModule *)auStack_10af8);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
             ::count(&this->m_protocol_type_map,(key_type *)auStack_10af8);
    std::__cxx11::string::~string((string *)auStack_10af8);
    if (sVar12 != 1) {
      std::
      vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
      ::push_back(&this->m_modules,&pMStack_10628);
      uStack_10cc9 = MessageModule::get_service_id(pMStack_10628);
      std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>::
      pair<unsigned_char,_ki::protocol::dml::MessageModule_*&,_true>
                (&pStack_10cc8,&uStack_10cc9,&pMStack_10628);
      pVar15 = std::
               map<unsigned_char,_ki::protocol::dml::MessageModule_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
               ::insert(&this->m_service_id_map,&pStack_10cc8);
      p_Stack_10ce0 = (_Base_ptr)pVar15.first._M_node;
      uStack_10cd8 = pVar15.second;
      MessageModule::get_protocol_type_abi_cxx11_((MessageModule *)auStack_10d28);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
                  *)(auStack_10d28 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_10d28,
                 &pMStack_10628);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
      ::insert(&this->m_protocol_type_map,(value_type *)(auStack_10d28 + 0x20));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>
               *)(auStack_10d28 + 0x20));
      std::__cxx11::string::~string((string *)auStack_10d28);
      if (text != (char *)0x0) {
        operator_delete__(text);
      }
      pMVar5 = pMStack_10628;
      rapidxml::xml_document<char>::~xml_document((xml_document<char> *)&e);
      std::ifstream::~ifstream(local_220);
      return pMVar5;
    }
    if (text != (char *)0x0) {
      operator_delete__(text);
    }
    pMVar5 = pMStack_10628;
    if (pMStack_10628 != (MessageModule *)0x0) {
      MessageModule::~MessageModule(pMStack_10628);
      operator_delete(pMVar5);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_10c90 + 0x20));
    std::operator<<((ostream *)(auStack_10c90 + 0x20),
                    "Message Module has already been loaded with Protocol Type ");
    MessageModule::get_protocol_type_abi_cxx11_((MessageModule *)auStack_10c90);
    std::operator<<((ostream *)(auStack_10c90 + 0x20),(string *)auStack_10c90);
    std::__cxx11::string::~string((string *)auStack_10c90);
    uStack_10cb1 = 1;
    pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    value_error::value_error(pvVar4,asStack_10cb0,OVERWRITES_LOOKUP);
    uStack_10cb1 = 0;
    __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
  }
  if (text != (char *)0x0) {
    operator_delete__(text);
  }
  pMVar5 = pMStack_10628;
  if (pMStack_10628 != (MessageModule *)0x0) {
    MessageModule::~MessageModule(pMStack_10628);
    operator_delete(pMVar5);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_10af8 + 0x48));
  std::operator<<((ostream *)(auStack_10af8 + 0x48),
                  "Message Module has already been loaded with Service ID ");
  bVar1 = MessageModule::get_service_id(pMStack_10628);
  std::ostream::operator<<(auStack_10af8 + 0x48,(ushort)bVar1);
  auStack_10af8[0x27] = 1;
  pvVar4 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::ostringstream::str();
  value_error::value_error(pvVar4,(string *)(auStack_10af8 + 0x28),OVERWRITES_LOOKUP);
  auStack_10af8[0x27] = 0;
  __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
}

Assistant:

const MessageModule *MessageManager::load_module(std::string filepath)
	{
		// Open the file
		std::ifstream ifs(filepath, std::ios::ate);
		if (!ifs.is_open())
		{
			std::ostringstream oss;
			oss << "Could not open file: " << filepath;
			throw value_error(oss.str(), value_error::MISSING_FILE);
		}

		// Load contents into memory
		size_t size = ifs.tellg();
		ifs.seekg(0, std::ios::beg);
		char *data = new char[size + 1] { 0 };
		ifs.read(data, size);

		// Parse the contents
		rapidxml::xml_document<> doc;
		try
		{
			doc.parse<0>(data);
		}
		catch (rapidxml::parse_error &e)
		{
			delete[] data;

			std::ostringstream oss;
			oss << "Failed to parse: " << filepath;
			throw parse_error(oss.str(), parse_error::INVALID_XML_DATA);
		}

		// It's safe to allocate the module we're working on now
		auto *message_module = new MessageModule();

		// Get the root node and iterate through children
		// Each child is a MessageTemplate
		auto *root = doc.first_node();
		for (auto *node = root->first_node();
			node; node = node->next_sibling())
		{
			// Parse the record node inside this node
			auto *record_node = node->first_node();
			if (!record_node)
				continue;
			auto *record = new ki::dml::Record();
			record->from_xml(record_node);

			// The message name is initially based on the element name
			const std::string message_name = node->name();
			if (message_name == "_ProtocolInfo")
			{
				auto *service_id_field = record->get_field<ki::dml::UBYT>("ServiceID");
				auto *type_field = record->get_field<ki::dml::STR>("ProtocolType");
				auto *description_field = record->get_field<ki::dml::STR>("ProtocolDescription");

				// Set the module metadata from this template
				if (service_id_field)
					message_module->set_service_id(service_id_field->get_value());
				if (type_field)
					message_module->set_protocol_type(type_field->get_value());
				if (description_field)
					message_module->set_protocol_description(description_field->get_value());
			}
			else
			{
				// Only do sorting after we've reached the final message
				// This only affects modules that aren't ordered with _MsgOrder.
				const bool auto_sort = node->next_sibling() == nullptr;

				// The template will use the record itself to figure out name and type;
				// we only give the XML data incase the record doesn't have it defined.
				auto *message_template = message_module->add_message_template(message_name, record, auto_sort);
				if (!message_template)
				{
					delete[] data;
					delete message_module;
					delete record;

					std::ostringstream oss;
					oss << "Failed to create message template for ";
					oss << message_name;
					throw value_error(oss.str());
				}
			}
		}

		// Make sure we aren't overwriting another module
		if (m_service_id_map.count(message_module->get_service_id()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Service ID ";
			oss << (uint16_t)message_module->get_service_id();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		if (m_protocol_type_map.count(message_module->get_protocol_type()) == 1)
		{
			delete[] data;
			delete message_module;

			std::ostringstream oss;
			oss << "Message Module has already been loaded with Protocol Type ";
			oss << message_module->get_protocol_type();
			throw value_error(oss.str(), value_error::OVERWRITES_LOOKUP);
		}

		// Add it to our maps
		m_modules.push_back(message_module);
		m_service_id_map.insert({ message_module->get_service_id(), message_module });
		m_protocol_type_map.insert({ message_module->get_protocol_type(), message_module });

		delete[] data;
		return message_module;
	}